

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QStatusBarPrivate::SBItem>::erase
          (QMovableArrayOps<QStatusBarPrivate::SBItem> *this,SBItem *b,qsizetype n)

{
  SBItem *__src;
  QArrayDataPointer<QStatusBarPrivate::SBItem> *pQVar1;
  SBItem *pSVar2;
  long in_RDX;
  QArrayDataPointer<QStatusBarPrivate::SBItem> *in_RSI;
  long in_RDI;
  SBItem *e;
  SBItem *in_stack_ffffffffffffffa8;
  QArrayDataPointer<QStatusBarPrivate::SBItem> *in_stack_ffffffffffffffb0;
  
  __src = (SBItem *)(&in_RSI->d + in_RDX * 2);
  std::destroy<QStatusBarPrivate::SBItem*>
            ((SBItem *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pQVar1 = (QArrayDataPointer<QStatusBarPrivate::SBItem> *)
           QArrayDataPointer<QStatusBarPrivate::SBItem>::begin
                     ((QArrayDataPointer<QStatusBarPrivate::SBItem> *)0x6a814a);
  if ((in_RSI == pQVar1) &&
     (pSVar2 = QArrayDataPointer<QStatusBarPrivate::SBItem>::end(in_stack_ffffffffffffffb0),
     __src != pSVar2)) {
    *(SBItem **)(in_RDI + 8) = __src;
  }
  else {
    pSVar2 = QArrayDataPointer<QStatusBarPrivate::SBItem>::end(in_stack_ffffffffffffffb0);
    if (__src != pSVar2) {
      pSVar2 = QArrayDataPointer<QStatusBarPrivate::SBItem>::end(in_RSI);
      memmove(in_RSI,__src,((long)pSVar2 - (long)__src >> 4) << 4);
    }
  }
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) - in_RDX;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;

        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.

        std::destroy(b, e);
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            memmove(static_cast<void *>(b), static_cast<const void *>(e), (static_cast<const T *>(this->end()) - e)*sizeof(T));
        }
        this->size -= n;
    }